

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int heap_add_entry(archive_read *a,heap_queue_conflict *heap,xar_file *file)

{
  ulong uVar1;
  int iVar2;
  xar_file **__dest;
  int local_4c;
  int new_size;
  xar_file **new_pending_files;
  int parent;
  int hole;
  uint64_t parent_id;
  uint64_t file_id;
  xar_file *file_local;
  heap_queue_conflict *heap_local;
  archive_read *a_local;
  
  if (heap->allocated <= heap->used) {
    if (heap->allocated < 0x400) {
      local_4c = 0x400;
    }
    else {
      local_4c = heap->allocated << 1;
    }
    if (local_4c <= heap->allocated) {
      archive_set_error(&a->archive,0xc,"Out of memory");
      return -0x1e;
    }
    __dest = (xar_file **)calloc((long)local_4c,8);
    if (__dest == (xar_file **)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory");
      return -0x1e;
    }
    if (heap->allocated != 0) {
      memcpy(__dest,heap->files,(long)heap->allocated << 3);
      free(heap->files);
    }
    heap->files = __dest;
    heap->allocated = local_4c;
  }
  uVar1 = file->id;
  new_pending_files._4_4_ = heap->used;
  heap->used = new_pending_files._4_4_ + 1;
  while( true ) {
    if (new_pending_files._4_4_ < 1) {
      *heap->files = file;
      return 0;
    }
    iVar2 = (new_pending_files._4_4_ + -1) / 2;
    if (heap->files[iVar2]->id <= uVar1) break;
    heap->files[new_pending_files._4_4_] = heap->files[iVar2];
    new_pending_files._4_4_ = iVar2;
  }
  heap->files[new_pending_files._4_4_] = file;
  return 0;
}

Assistant:

static int
heap_add_entry(struct archive_read *a,
    struct heap_queue *heap, struct xar_file *file)
{
	uint64_t file_id, parent_id;
	int hole, parent;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct xar_file **new_pending_files;
		int new_size;

		if (heap->allocated < 1024)
			new_size = 1024;
		else
			new_size = heap->allocated * 2;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct xar_file **)
		    calloc(new_size, sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		if (heap->allocated) {
			memcpy(new_pending_files, heap->files,
			    heap->allocated * sizeof(new_pending_files[0]));
			free(heap->files);
		}
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_id = file->id;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_id = heap->files[parent]->id;
		if (file_id >= parent_id) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}